

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ElementSelectSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElementSelectSyntax,slang::parsing::Token,slang::syntax::SelectorSyntax*,slang::parsing::Token>
          (BumpAllocator *this,Token *args,SelectorSyntax **args_1,Token *args_2)

{
  SelectorSyntax *pSVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  ElementSelectSyntax *pEVar12;
  
  pEVar12 = (ElementSelectSyntax *)allocate(this,0x40,8);
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar2 = args->info;
  pSVar1 = *args_1;
  TVar8 = args_2->kind;
  uVar9 = args_2->field_0x2;
  NVar10.raw = (args_2->numFlags).raw;
  uVar11 = args_2->rawLen;
  pIVar3 = args_2->info;
  (pEVar12->super_SyntaxNode).kind = ElementSelect;
  (pEVar12->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pEVar12->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pEVar12->openBracket).kind = TVar4;
  (pEVar12->openBracket).field_0x2 = uVar5;
  (pEVar12->openBracket).numFlags = (NumericTokenFlags)NVar6.raw;
  (pEVar12->openBracket).rawLen = uVar7;
  (pEVar12->openBracket).info = pIVar2;
  pEVar12->selector = pSVar1;
  (pEVar12->closeBracket).kind = TVar8;
  (pEVar12->closeBracket).field_0x2 = uVar9;
  (pEVar12->closeBracket).numFlags = (NumericTokenFlags)NVar10.raw;
  (pEVar12->closeBracket).rawLen = uVar11;
  (pEVar12->closeBracket).info = pIVar3;
  if (pSVar1 != (SelectorSyntax *)0x0) {
    (pSVar1->super_SyntaxNode).parent = (SyntaxNode *)pEVar12;
  }
  return pEVar12;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }